

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlutils.cpp
# Opt level: O0

bool QXmlUtils::isPublicID(QStringView candidate)

{
  char16_t cVar1;
  bool bVar2;
  const_iterator pvVar3;
  char16_t *pcVar4;
  long in_FS_OFFSET;
  ushort cp;
  const_iterator __end1;
  const_iterator __begin1;
  QStringView *__range1;
  QChar ch;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  const_iterator local_30;
  bool local_1b;
  QChar local_1a [9];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = QStringView::begin((QStringView *)0x4b10e3);
  pvVar3 = QStringView::end((QStringView *)
                            CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  for (; local_30 != pvVar3; local_30 = local_30 + 1) {
    local_1a[0].ucs = local_30->ucs;
    pcVar4 = QChar::unicode(local_1a);
    cVar1 = *pcVar4;
    bVar2 = QtMiscUtils::isAsciiLetterOrNumber(L'\0');
    if (!bVar2) {
      switch(cVar1) {
      case L'\n':
      case L'\r':
      case L' ':
      case L'!':
      case L'#':
      case L'$':
      case L'%':
      case L'\'':
      case L'(':
      case L')':
      case L'*':
      case L'+':
      case L',':
      case L'-':
      case L'.':
      case L'/':
      case L':':
      case L';':
      case L'=':
      case L'?':
      case L'@':
      case L'_':
        break;
      default:
        local_1b = false;
        goto LAB_004b118f;
      }
    }
  }
  local_1b = true;
LAB_004b118f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_1b;
  }
  __stack_chk_fail();
}

Assistant:

bool QXmlUtils::isPublicID(QStringView candidate)
{
    for (QChar ch : candidate) {
        const ushort cp = ch.unicode();

        if (isAsciiLetterOrNumber(cp))
            continue;

        switch (cp)
        {
            /* Fallthrough all these. */
            case 0x20:
            case 0x0D:
            case 0x0A:
            case '-':
            case '\'':
            case '(':
            case ')':
            case '+':
            case ',':
            case '.':
            case '/':
            case ':':
            case '=':
            case '?':
            case ';':
            case '!':
            case '*':
            case '#':
            case '@':
            case '$':
            case '_':
            case '%':
                continue;
            default:
                return false;
        }
    }

    return true;
}